

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcAdjacencyInfo.h
# Opt level: O0

O3DGCErrorCode __thiscall o3dgc::AdjacencyInfo::AllocateNeighborsArray(AdjacencyInfo *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  long *plVar3;
  long local_18;
  long i;
  AdjacencyInfo *this_local;
  
  for (local_18 = 1; local_18 < this->m_numElements; local_18 = local_18 + 1) {
    this->m_numNeighbors[local_18] =
         this->m_numNeighbors[local_18 + -1] + this->m_numNeighbors[local_18];
  }
  if (this->m_neighborsSize < this->m_numNeighbors[this->m_numElements + -1]) {
    if (this->m_neighbors != (long *)0x0) {
      operator_delete__(this->m_neighbors);
    }
    this->m_neighborsSize = this->m_numNeighbors[this->m_numElements + -1];
    auVar1._8_8_ = 0;
    auVar1._0_8_ = this->m_neighborsSize;
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    plVar3 = (long *)operator_new__(uVar2);
    this->m_neighbors = plVar3;
  }
  return O3DGC_OK;
}

Assistant:

O3DGCErrorCode          AllocateNeighborsArray()
                                {
                                    for(long i = 1; i < m_numElements; ++i)
                                    {
                                        m_numNeighbors[i] += m_numNeighbors[i-1];
                                    }
                                    if (m_numNeighbors[m_numElements-1] > m_neighborsSize)
                                    {
                                        delete [] m_neighbors;
                                        m_neighborsSize = m_numNeighbors[m_numElements-1];
                                        m_neighbors = new long [m_neighborsSize];
                                    }
                                    return O3DGC_OK;
                                }